

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arealight.hpp
# Opt level: O0

void calculateLH(int n_vert,vec3f *position,vec3f *normal,float *LHbuffer,char *light_obj_file)

{
  double dVar1;
  treenode *ptVar2;
  ostream *poVar3;
  float *pfVar4;
  data_t dVar5;
  data_t dVar6;
  vec3f vVar7;
  int local_1f68;
  int local_1f64;
  int j;
  int i;
  vec3f local_1f58;
  vec3f local_1f48;
  float local_1f3c;
  undefined8 uStack_1f38;
  float irr;
  data_t local_1f30;
  vec3f local_1f28;
  vec3f local_1f18;
  undefined1 local_1f08 [8];
  vec3f w;
  SampleInfo info;
  int _;
  int n_sample;
  float y [225];
  double local_1b48;
  double acc [225];
  undefined1 local_1438 [8];
  MT19937Sampler sampler;
  int vert;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  TriangleMesh light;
  char *light_obj_file_local;
  float *LHbuffer_local;
  vec3f *normal_local;
  vec3f *position_local;
  int n_vert_local;
  
  light.super_BasicContainer.root = (treenode *)light_obj_file;
  github111116::ConsoleLogger::log<char[18]>(&console,(char (*) [18])"calculating LH...");
  ptVar2 = light.super_BasicContainer.root;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,(char *)ptVar2,&local_91);
  TriangleMesh::TriangleMesh((TriangleMesh *)local_70,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  for (sampler.generator._M_p._0_4_ = 0; (int)sampler.generator._M_p < n_vert;
      sampler.generator._M_p._0_4_ = (int)sampler.generator._M_p + 1) {
    if ((int)sampler.generator._M_p % 100 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"\r    LH progress: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)sampler.generator._M_p);
      poVar3 = std::operator<<(poVar3,"/");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_vert);
      std::operator<<(poVar3,"          ");
    }
    MT19937Sampler::MT19937Sampler((MT19937Sampler *)local_1438,0,0);
    memset(&local_1b48,0,0x708);
    info.pdf = 1.4013e-43;
    for (info.normal.z = 0.0; (int)info.normal.z < 100;
        info.normal.z = (data_t)((int)info.normal.z + 1)) {
      BasicContainer::sampleSurface
                ((SampleInfo *)&w.y,(BasicContainer *)local_70,(Sampler *)local_1438);
      vVar7 = operator-((vec3f *)&w.y,position + (int)sampler.generator._M_p);
      local_1f28.z = vVar7.z;
      local_1f28._0_8_ = vVar7._0_8_;
      local_1f18._0_8_ = local_1f28._0_8_;
      local_1f18.z = local_1f28.z;
      vVar7 = normalized(&local_1f18);
      local_1f30 = vVar7.z;
      uStack_1f38 = vVar7._0_8_;
      local_1f08 = (undefined1  [8])uStack_1f38;
      w.x = local_1f30;
      dVar5 = dot((vec3f *)&info.p.y,(vec3f *)local_1f08);
      vVar7 = operator-((vec3f *)&w.y,position + (int)sampler.generator._M_p);
      local_1f58.z = vVar7.z;
      local_1f58._0_8_ = vVar7._0_8_;
      local_1f48._0_8_ = local_1f58._0_8_;
      local_1f48.z = local_1f58.z;
      dVar6 = sqrlen(&local_1f48);
      local_1f3c = (dVar5 / dVar6) / info.normal.y;
      dVar1 = std::fabs((double)(ulong)(uint)local_1f3c);
      local_1f3c = SUB84(dVar1,0);
      i = 0;
      j = (int)dot(normal + (int)sampler.generator._M_p,(vec3f *)local_1f08);
      pfVar4 = std::max<float>((float *)&i,(float *)&j);
      local_1f3c = local_1f3c * *pfVar4;
      SHEvaluate((vec3f *)local_1f08,0xe,(float *)&_);
      for (local_1f64 = 0; local_1f64 < 0xe1; local_1f64 = local_1f64 + 1) {
        acc[(long)local_1f64 + -1] =
             (double)(local_1f3c * (float)(&_)[local_1f64]) + acc[(long)local_1f64 + -1];
      }
    }
    for (local_1f68 = 0; local_1f68 < 0xe1; local_1f68 = local_1f68 + 1) {
      LHbuffer[(int)sampler.generator._M_p * 0xe1 + local_1f68] =
           (float)(acc[(long)local_1f68 + -1] / 100.0);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"\r    LH progress: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_vert);
  poVar3 = std::operator<<(poVar3,"/");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_vert);
  std::operator<<(poVar3,"           \n");
  TriangleMesh::~TriangleMesh((TriangleMesh *)local_70);
  return;
}

Assistant:

void calculateLH(int n_vert, const vec3f* position, const vec3f* normal, float* LHbuffer, const char light_obj_file[])
{
	console.log("calculating LH...");
	TriangleMesh light(light_obj_file);
	for (int vert=0; vert<n_vert; ++vert)
	{
		if (vert%100==0)
			std::cerr << "\r    LH progress: " << vert << "/" << n_vert << "          ";
		// sphfunc LH = [&](vec3f w)
		// {
		// 	Primitive::Hit h;
		// 	if (!light.intersect(Ray(position[i],w), &h)) return 0.0f;
		// 	if (w.y < 0) return 0.0f;
		// 	return std::max(0.0f, dot(normal[i],w));
		// };

	    MT19937Sampler sampler;

	    double acc[N_COEFFS];
    	float y[N_COEFFS];
	    memset(acc, 0, sizeof acc);
	    const int n_sample = 100;
    	for (int _=0; _<n_sample; ++_) {
			auto info = light.sampleSurface(sampler);
			vec3f w = normalized(info.p - position[vert]);
			float irr = dot(info.normal, w) / sqrlen(info.p - position[vert]) / info.pdf;
			irr = fabs(irr);
			irr *= std::max(0.0f, dot(normal[vert],w));
        	SHEvaluate(w, shorder-1, y);
	        for (int i=0; i<N_COEFFS; ++i)
	            acc[i] += irr * y[i];
    	}
    	for (int j=0; j<N_COEFFS; ++j)
    		LHbuffer[vert*N_COEFFS+j] = acc[j] / n_sample;
	}
	std::cerr << "\r    LH progress: " << n_vert << "/" << n_vert << "           \n";
}